

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void * delpos234_internal(tree234 *t,int index)

{
  node234 *pnVar1;
  node234_conflict *pnVar2;
  int i;
  uint uVar3;
  node234 *pnVar4;
  void **ppvVar5;
  uint uVar6;
  node234 *pnVar7;
  void *pvVar8;
  node234_conflict *sib;
  void *pvVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  node234_conflict *a;
  node234 *pnVar18;
  ulong uVar19;
  ulong uVar20;
  node234_conflict *ptr;
  bool bVar21;
  
  uVar19 = 0xffffffff;
  pvVar9 = (void *)0x0;
  pnVar18 = t->root;
LAB_0013a922:
  do {
    if (pnVar18 == (node234_conflict *)0x0) {
      ptr = (node234_conflict *)0x0;
      break;
    }
    uVar16 = pnVar18->counts[0];
    uVar3 = 0;
    bVar21 = true;
    bVar15 = true;
    iVar10 = index;
    if (index < (int)uVar16) {
LAB_0013a977:
      ptr = pnVar18->kids[uVar3];
      if (ptr->elems[1] == (void *)0x0) {
        if ((int)uVar16 <= index) {
          uVar6 = uVar3 - 1;
          pnVar7 = pnVar18->kids[uVar6];
          if (pnVar7->elems[1] != (void *)0x0) {
            uVar16 = (uint)(pnVar7->elems[2] == (void *)0x0);
            ptr->counts[2] = ptr->counts[1];
            ptr->elems[1] = ptr->elems[0];
            pnVar1 = ptr->kids[1];
            ptr->kids[1] = ptr->kids[0];
            ptr->kids[2] = pnVar1;
            ptr->counts[1] = ptr->counts[0];
            ptr->elems[0] = pnVar18->elems[uVar6];
            uVar13 = uVar16 ^ 3;
            pnVar1 = pnVar7->kids[uVar13];
            ptr->kids[0] = pnVar1;
            ptr->counts[0] = pnVar7->counts[uVar13];
            if (pnVar1 != (node234 *)0x0) {
              pnVar1->parent = ptr;
            }
            uVar16 = 2 - uVar16;
            pnVar18->elems[uVar6] = pnVar7->elems[uVar16];
            iVar11 = 0;
            pnVar7->kids[uVar13] = (node234 *)0x0;
            pnVar7->counts[uVar13] = 0;
            pnVar7->elems[uVar16] = (void *)0x0;
            iVar14 = 0;
            if (ptr != (node234_conflict *)0x0) {
              lVar17 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + ptr->counts[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                iVar14 = (iVar14 + 1) - (uint)(ptr->elems[lVar17] == (void *)0x0);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
            }
            pnVar18->counts[uVar3] = iVar14;
            iVar14 = pnVar18->counts[uVar6];
            if (pnVar7 != (node234 *)0x0) {
              lVar17 = 0;
              iVar11 = 0;
              do {
                iVar11 = iVar11 + pnVar7->counts[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                iVar11 = (iVar11 + 1) - (uint)(pnVar7->elems[lVar17] == (void *)0x0);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
            }
            pnVar18->counts[uVar6] = iVar11;
            iVar10 = (iVar10 + iVar14) - iVar11;
            goto LAB_0013ad2e;
          }
        }
        if (bVar15) {
          pnVar7 = pnVar18->kids[uVar3 + 1];
          if ((pnVar7 != (node234 *)0x0) && (pnVar7->elems[1] != (void *)0x0)) {
            ptr->elems[1] = pnVar18->elems[uVar3];
            pnVar1 = pnVar7->kids[0];
            ptr->kids[2] = pnVar1;
            ptr->counts[2] = pnVar7->counts[0];
            if (pnVar1 != (node234 *)0x0) {
              pnVar1->parent = ptr;
            }
            pnVar18->elems[uVar3] = pnVar7->elems[0];
            pnVar7->kids[0] = pnVar7->kids[1];
            pnVar7->counts[0] = pnVar7->counts[1];
            uVar12 = 0;
            do {
              pvVar8 = pnVar7->elems[uVar12 + 1];
              if (pvVar8 == (void *)0x0) goto LAB_0013ab28;
              pnVar7->kids[uVar12 + 1] = pnVar7->kids[uVar12 + 2];
              pnVar7->counts[uVar12 + 1] = pnVar7->counts[uVar12 + 2];
              pnVar7->elems[uVar12] = pvVar8;
              uVar12 = uVar12 + 1;
            } while (uVar12 == 1);
            uVar12 = 2;
LAB_0013ab28:
            uVar12 = uVar12 & 0xffffffff;
            iVar11 = 0;
            pnVar7->kids[uVar12 + 1] = (node234 *)0x0;
            pnVar7->counts[uVar12 + 1] = 0;
            pnVar7->elems[uVar12] = (void *)0x0;
            iVar14 = 0;
            if (ptr != (node234_conflict *)0x0) {
              lVar17 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + ptr->counts[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                iVar14 = (iVar14 + 1) - (uint)(ptr->elems[lVar17] == (void *)0x0);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
            }
            pnVar18->counts[uVar3] = iVar14;
            lVar17 = 0;
            do {
              iVar11 = iVar11 + pnVar7->counts[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            lVar17 = 0;
            do {
              iVar11 = (iVar11 + 1) - (uint)(pnVar7->elems[lVar17] == (void *)0x0);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            pnVar18->counts[uVar3 + 1] = iVar11;
            goto LAB_0013ad2e;
          }
        }
        uVar6 = 0;
        if ((int)uVar16 <= index) {
          uVar6 = uVar3 - 1;
          iVar10 = iVar10 + pnVar18->counts[uVar6] + 1;
        }
        uVar12 = (ulong)uVar6;
        pnVar7 = pnVar18->kids[uVar12];
        ptr = pnVar18->kids[uVar12 + 1];
        ptr->elems[2] = ptr->elems[0];
        ptr->kids[2] = ptr->kids[0];
        ptr->kids[3] = ptr->kids[1];
        *(undefined8 *)(ptr->counts + 2) = *(undefined8 *)ptr->counts;
        ptr->elems[1] = pnVar18->elems[uVar12];
        pnVar1 = pnVar7->kids[1];
        ptr->kids[1] = pnVar1;
        ptr->counts[1] = pnVar7->counts[1];
        if (pnVar1 != (node234 *)0x0) {
          pnVar1->parent = ptr;
        }
        ptr->elems[0] = pnVar7->elems[0];
        pnVar1 = pnVar7->kids[0];
        ptr->kids[0] = pnVar1;
        ptr->counts[0] = pnVar7->counts[0];
        if (pnVar1 != (node234 *)0x0) {
          pnVar1->parent = ptr;
        }
        if (ptr == (node234_conflict *)0x0) {
          iVar11 = 0;
        }
        else {
          lVar17 = 0;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + ptr->counts[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          lVar17 = 0;
          do {
            iVar11 = (iVar11 + 1) - (uint)(ptr->elems[lVar17] == (void *)0x0);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        pnVar18->counts[uVar12 + 1] = iVar11;
        safefree(pnVar7);
        pnVar7 = pnVar18->kids[uVar12 + 1];
        if (pnVar7 == (node234 *)0x0) {
          bVar21 = true;
        }
        else {
          uVar12 = uVar12 - 2;
          do {
            uVar20 = uVar12;
            pnVar18->kids[uVar20 + 2] = pnVar7;
            pnVar18->counts[uVar20 + 2] = pnVar18->counts[uVar20 + 3];
            if (uVar20 == 0) {
              pnVar7 = (node234 *)0x0;
            }
            else {
              pnVar7 = pnVar18[1].kids[uVar20 - 1];
            }
            pnVar18->elems[uVar20 + 2] = pnVar7;
            if (uVar20 == 0) {
              uVar12 = 3;
              goto LAB_0013ace4;
            }
            pnVar7 = *(node234 **)(pnVar18->counts + uVar20 * 2);
            uVar12 = uVar20 + 1;
          } while (pnVar7 != (node234 *)0x0);
          uVar12 = uVar20 + 3;
LAB_0013ace4:
          bVar21 = 0xfffffffffffffffd < uVar20;
        }
        uVar12 = uVar12 & 0xffffffff;
        pnVar18->kids[uVar12] = (node234 *)0x0;
        pnVar18->counts[uVar12] = 0;
        if (bVar21) {
          pnVar18->elems[uVar12] = (void *)0x0;
        }
        bVar21 = true;
        if (pnVar18->elems[0] == (void *)0x0) {
          t->root = ptr;
          ptr->parent = (node234_conflict *)0x0;
          safefree(pnVar18);
        }
      }
    }
    else {
      iVar10 = ~uVar16 + index;
      if (iVar10 < 0) {
        uVar19 = 0;
      }
      else {
        uVar3 = 1;
        if (iVar10 < pnVar18->counts[1]) {
LAB_0013a974:
          bVar15 = true;
          goto LAB_0013a977;
        }
        iVar10 = iVar10 + ~pnVar18->counts[1];
        if (iVar10 < 0) {
          uVar19 = 1;
        }
        else {
          uVar3 = 2;
          if (iVar10 < pnVar18->counts[2]) goto LAB_0013a974;
          bVar15 = false;
          iVar10 = iVar10 + ~pnVar18->counts[2];
          uVar3 = 3;
          if (-1 < iVar10) goto LAB_0013a977;
          uVar19 = 2;
        }
      }
      bVar21 = false;
      ptr = pnVar18;
    }
LAB_0013ad2e:
    index = iVar10;
    pnVar18 = ptr;
  } while (bVar21);
  uVar16 = (uint)uVar19;
  if (pvVar9 == (void *)0x0) {
    pvVar9 = ptr->elems[(int)uVar16];
  }
  if (uVar16 == 0xffffffff) {
    return (void *)0x0;
  }
  if (((ptr->parent == (node234_conflict *)0x0) && (ptr->elems[1] == (void *)0x0)) &&
     (ptr->kids[0] == (node234 *)0x0)) {
    safefree(ptr);
    t->root = (node234_conflict *)0x0;
    return pvVar9;
  }
  if ((ptr->kids[0] != (node234 *)0x0) || (ptr->elems[1] == (void *)0x0)) {
    pnVar18 = ptr->kids[uVar19];
    if (pnVar18->elems[1] == (void *)0x0) {
      pnVar7 = ptr->kids[uVar19 + 1];
      pnVar1 = pnVar7;
      if (pnVar7->elems[1] == (void *)0x0) {
        pnVar18->elems[1] = ptr->elems[uVar19];
        pnVar1 = pnVar7->kids[0];
        pnVar18->kids[2] = pnVar1;
        pnVar18->counts[2] = pnVar7->counts[0];
        if (pnVar1 != (node234 *)0x0) {
          pnVar1->parent = pnVar18;
        }
        pnVar18->elems[2] = pnVar7->elems[0];
        pnVar1 = pnVar7->kids[1];
        pnVar18->kids[3] = pnVar1;
        pnVar18->counts[3] = pnVar7->counts[1];
        if (pnVar1 != (node234 *)0x0) {
          pnVar1->parent = pnVar18;
        }
        safefree(pnVar7);
        if (pnVar18 == (node234 *)0x0) {
          iVar10 = 0;
        }
        else {
          lVar17 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + pnVar18->counts[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          lVar17 = 0;
          do {
            iVar10 = (iVar10 + 1) - (uint)(pnVar18->elems[lVar17] == (void *)0x0);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        ptr->counts[uVar19] = iVar10;
        if ((int)uVar16 < 2) {
          lVar17 = uVar19 + 8;
          do {
            iVar10 = (int)lVar17;
            if (ptr->kids[lVar17 + -1] == (node234 *)0x0) {
              uVar16 = iVar10 - 8;
              goto LAB_0013aee6;
            }
            ptr->kids[lVar17 + -2] = ptr->kids[lVar17 + -1];
            ptr->kids[lVar17 + -7] = ptr->kids[lVar17 + -6];
            ptr->counts[lVar17 + -7] = ptr->counts[lVar17 + -6];
            lVar17 = lVar17 + 1;
          } while (iVar10 != 9);
          uVar16 = 2;
        }
LAB_0013aee6:
        uVar12 = (ulong)uVar16;
        ptr->elems[uVar12] = (void *)0x0;
        ptr->kids[uVar12 + 1] = (node234 *)0x0;
        ptr->counts[uVar12 + 1] = 0;
        if (ptr->elems[0] == (void *)0x0) {
          t->root = pnVar18;
          pnVar18->parent = (node234_conflict *)0x0;
          safefree(ptr);
        }
        index = pnVar18->counts[0] + pnVar18->counts[1] + 1;
      }
      else {
        do {
          pnVar18 = pnVar1;
          pnVar1 = pnVar18->kids[0];
        } while (pnVar1 != (node234 *)0x0);
        ptr->elems[uVar19] = pnVar18->elems[0];
        index = 0;
        pnVar18 = pnVar7;
      }
    }
    else {
      pnVar7 = pnVar18->kids[0];
      pnVar1 = pnVar18;
      while (pnVar7 != (node234 *)0x0) {
        pnVar4 = pnVar1->kids[3];
        if (((pnVar1->kids[3] == (node234 *)0x0) &&
            (pnVar4 = pnVar1->kids[2], pnVar1->kids[2] == (node234 *)0x0)) &&
           (pnVar4 = pnVar7, pnVar1->kids[1] != (node234 *)0x0)) {
          pnVar4 = pnVar1->kids[1];
        }
        pnVar1 = pnVar4;
        pnVar7 = pnVar4->kids[0];
      }
      pvVar8 = pnVar1->elems[2];
      if ((pvVar8 == (void *)0x0) && (pvVar8 = pnVar1->elems[1], pvVar8 == (void *)0x0)) {
        pvVar8 = pnVar1->elems[0];
      }
      ptr->elems[uVar19] = pvVar8;
      index = ptr->counts[uVar19] + -1;
    }
    goto LAB_0013a922;
  }
  if ((int)uVar16 < 2) {
    ppvVar5 = ptr->elems + uVar19 + 1;
    do {
      if (*ppvVar5 == (void *)0x0) goto LAB_0013af75;
      ppvVar5[-1] = *ppvVar5;
      iVar10 = (int)uVar19;
      ppvVar5 = ppvVar5 + 1;
      uVar19 = (ulong)(iVar10 + 1);
    } while (iVar10 < 1);
    uVar19 = 2;
  }
LAB_0013af75:
  ptr->elems[uVar19] = (void *)0x0;
  while (pnVar2 = ptr->parent, pnVar2 != (node234_conflict *)0x0) {
    if (pnVar2->kids[0] == ptr) {
      uVar19 = 0;
    }
    else if (pnVar2->kids[1] == ptr) {
      uVar19 = 1;
    }
    else {
      uVar19 = (ulong)(pnVar2->kids[2] == ptr) ^ 3;
    }
    pnVar2->counts[uVar19] = pnVar2->counts[uVar19] + -1;
    ptr = pnVar2;
  }
  return pvVar9;
}

Assistant:

static void *delpos234_internal(tree234 * t, int index)
{
    node234 *n;
    void *retval;
    int ei = -1;

    retval = 0;

    n = t->root;
    LOG(("deleting item %d from tree %p\n", index, t));
    while (1) {
        while (n) {
            int ki;
            node234 *sub;

            LOG(
                ("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d index=%d\n",
                 n, n->kids[0], n->counts[0], n->elems[0], n->kids[1],
                 n->counts[1], n->elems[1], n->kids[2], n->counts[2],
                 n->elems[2], n->kids[3], n->counts[3], index));
            if (index < n->counts[0]) {
                ki = 0;
            } else if (index -= n->counts[0] + 1, index < 0) {
                ei = 0;
                break;
            } else if (index < n->counts[1]) {
                ki = 1;
            } else if (index -= n->counts[1] + 1, index < 0) {
                ei = 1;
                break;
            } else if (index < n->counts[2]) {
                ki = 2;
            } else if (index -= n->counts[2] + 1, index < 0) {
                ei = 2;
                break;
            } else {
                ki = 3;
            }
            /*
             * Recurse down to subtree ki. If it has only one element,
             * we have to do some transformation to start with.
             */
            LOG(("  moving to subtree %d\n", ki));
            sub = n->kids[ki];
            if (!sub->elems[1]) {
                LOG(("  subtree has only one element!\n"));
                if (ki > 0 && n->kids[ki - 1]->elems[1]) {
                    /*
                     * Case 3a, left-handed variant. Child ki has
                     * only one element, but child ki-1 has two or
                     * more. So we need to move a subtree from ki-1
                     * to ki.
                     *
                     *                . C .                     . B .
                     *               /     \     ->            /     \
                     * [more] a A b B c   d D e      [more] a A b   c C d D e
                     */
                    node234 *sib = n->kids[ki - 1];
                    int lastelem = (sib->elems[2] ? 2 :
                                    sib->elems[1] ? 1 : 0);
                    sub->kids[2] = sub->kids[1];
                    sub->counts[2] = sub->counts[1];
                    sub->elems[1] = sub->elems[0];
                    sub->kids[1] = sub->kids[0];
                    sub->counts[1] = sub->counts[0];
                    sub->elems[0] = n->elems[ki - 1];
                    sub->kids[0] = sib->kids[lastelem + 1];
                    sub->counts[0] = sib->counts[lastelem + 1];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;
                    n->elems[ki - 1] = sib->elems[lastelem];
                    sib->kids[lastelem + 1] = NULL;
                    sib->counts[lastelem + 1] = 0;
                    sib->elems[lastelem] = NULL;
                    n->counts[ki] = countnode234(sub);
                    LOG(("  case 3a left\n"));
                    LOG(
                        ("  index and left subtree count before adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                    index += n->counts[ki - 1];
                    n->counts[ki - 1] = countnode234(sib);
                    index -= n->counts[ki - 1];
                    LOG(
                        ("  index and left subtree count after adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                } else if (ki < 3 && n->kids[ki + 1]
                           && n->kids[ki + 1]->elems[1]) {
                    /*
                     * Case 3a, right-handed variant. ki has only
                     * one element but ki+1 has two or more. Move a
                     * subtree from ki+1 to ki.
                     *
                     *      . B .                             . C .
                     *     /     \                ->         /     \
                     *  a A b   c C d D e [more]      a A b B c   d D e [more]
                     */
                    node234 *sib = n->kids[ki + 1];
                    int j;
                    sub->elems[1] = n->elems[ki];
                    sub->kids[2] = sib->kids[0];
                    sub->counts[2] = sib->counts[0];
                    if (sub->kids[2])
                        sub->kids[2]->parent = sub;
                    n->elems[ki] = sib->elems[0];
                    sib->kids[0] = sib->kids[1];
                    sib->counts[0] = sib->counts[1];
                    for (j = 0; j < 2 && sib->elems[j + 1]; j++) {
                        sib->kids[j + 1] = sib->kids[j + 2];
                        sib->counts[j + 1] = sib->counts[j + 2];
                        sib->elems[j] = sib->elems[j + 1];
                    }
                    sib->kids[j + 1] = NULL;
                    sib->counts[j + 1] = 0;
                    sib->elems[j] = NULL;
                    n->counts[ki] = countnode234(sub);
                    n->counts[ki + 1] = countnode234(sib);
                    LOG(("  case 3a right\n"));
                } else {
                    /*
                     * Case 3b. ki has only one element, and has no
                     * neighbour with more than one. So pick a
                     * neighbour and merge it with ki, taking an
                     * element down from n to go in the middle.
                     *
                     *      . B .                .
                     *     /     \     ->        |
                     *  a A b   c C d      a A b B c C d
                     *
                     * (Since at all points we have avoided
                     * descending to a node with only one element,
                     * we can be sure that n is not reduced to
                     * nothingness by this move, _unless_ it was
                     * the very first node, ie the root of the
                     * tree. In that case we remove the now-empty
                     * root and replace it with its single large
                     * child as shown.)
                     */
                    node234 *sib;
                    int j;

                    if (ki > 0) {
                        ki--;
                        index += n->counts[ki] + 1;
                    }
                    sib = n->kids[ki];
                    sub = n->kids[ki + 1];

                    sub->kids[3] = sub->kids[1];
                    sub->counts[3] = sub->counts[1];
                    sub->elems[2] = sub->elems[0];
                    sub->kids[2] = sub->kids[0];
                    sub->counts[2] = sub->counts[0];
                    sub->elems[1] = n->elems[ki];
                    sub->kids[1] = sib->kids[1];
                    sub->counts[1] = sib->counts[1];
                    if (sub->kids[1])
                        sub->kids[1]->parent = sub;
                    sub->elems[0] = sib->elems[0];
                    sub->kids[0] = sib->kids[0];
                    sub->counts[0] = sib->counts[0];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;

                    n->counts[ki + 1] = countnode234(sub);

                    sfree(sib);

                    /*
                     * That's built the big node in sub. Now we
                     * need to remove the reference to sib in n.
                     */
                    for (j = ki; j < 3 && n->kids[j + 1]; j++) {
                        n->kids[j] = n->kids[j + 1];
                        n->counts[j] = n->counts[j + 1];
                        n->elems[j] = j < 2 ? n->elems[j + 1] : NULL;
                    }
                    n->kids[j] = NULL;
                    n->counts[j] = 0;
                    if (j < 3)
                        n->elems[j] = NULL;
                    LOG(("  case 3b ki=%d\n", ki));

                    if (!n->elems[0]) {
                        /*
                         * The root is empty and needs to be
                         * removed.
                         */
                        LOG(("  shifting root!\n"));
                        t->root = sub;
                        sub->parent = NULL;
                        sfree(n);
                    }
                }
            }
            n = sub;
        }
        if (!retval)
            retval = n->elems[ei];

        if (ei == -1)
            return NULL;               /* although this shouldn't happen */

        /*
         * Treat special case: this is the one remaining item in
         * the tree. n is the tree root (no parent), has one
         * element (no elems[1]), and has no kids (no kids[0]).
         */
        if (!n->parent && !n->elems[1] && !n->kids[0]) {
            LOG(("  removed last element in tree\n"));
            sfree(n);
            t->root = NULL;
            return retval;
        }

        /*
         * Now we have the element we want, as n->elems[ei], and we
         * have also arranged for that element not to be the only
         * one in its node. So...
         */

        if (!n->kids[0] && n->elems[1]) {
            /*
             * Case 1. n is a leaf node with more than one element,
             * so it's _really easy_. Just delete the thing and
             * we're done.
             */
            int i;
            LOG(("  case 1\n"));
            for (i = ei; i < 2 && n->elems[i + 1]; i++)
                n->elems[i] = n->elems[i + 1];
            n->elems[i] = NULL;
            /*
             * Having done that to the leaf node, we now go back up
             * the tree fixing the counts.
             */
            while (n->parent) {
                int childnum;
                childnum = (n->parent->kids[0] == n ? 0 :
                            n->parent->kids[1] == n ? 1 :
                            n->parent->kids[2] == n ? 2 : 3);
                n->parent->counts[childnum]--;
                n = n->parent;
            }
            return retval;             /* finished! */
        } else if (n->kids[ei]->elems[1]) {
            /*
             * Case 2a. n is an internal node, and the root of the
             * subtree to the left of e has more than one element.
             * So find the predecessor p to e (ie the largest node
             * in that subtree), place it where e currently is, and
             * then start the deletion process over again on the
             * subtree with p as target.
             */
            node234 *m = n->kids[ei];
            void *target;
            LOG(("  case 2a\n"));
            while (m->kids[0]) {
                m = (m->kids[3] ? m->kids[3] :
                     m->kids[2] ? m->kids[2] :
                     m->kids[1] ? m->kids[1] : m->kids[0]);
            }
            target = (m->elems[2] ? m->elems[2] :
                      m->elems[1] ? m->elems[1] : m->elems[0]);
            n->elems[ei] = target;
            index = n->counts[ei] - 1;
            n = n->kids[ei];
        } else if (n->kids[ei + 1]->elems[1]) {
            /*
             * Case 2b, symmetric to 2a but s/left/right/ and
             * s/predecessor/successor/. (And s/largest/smallest/).
             */
            node234 *m = n->kids[ei + 1];
            void *target;
            LOG(("  case 2b\n"));
            while (m->kids[0]) {
                m = m->kids[0];
            }
            target = m->elems[0];
            n->elems[ei] = target;
            n = n->kids[ei + 1];
            index = 0;
        } else {
            /*
             * Case 2c. n is an internal node, and the subtrees to
             * the left and right of e both have only one element.
             * So combine the two subnodes into a single big node
             * with their own elements on the left and right and e
             * in the middle, then restart the deletion process on
             * that subtree, with e still as target.
             */
            node234 *a = n->kids[ei], *b = n->kids[ei + 1];
            int j;

            LOG(("  case 2c\n"));
            a->elems[1] = n->elems[ei];
            a->kids[2] = b->kids[0];
            a->counts[2] = b->counts[0];
            if (a->kids[2])
                a->kids[2]->parent = a;
            a->elems[2] = b->elems[0];
            a->kids[3] = b->kids[1];
            a->counts[3] = b->counts[1];
            if (a->kids[3])
                a->kids[3]->parent = a;
            sfree(b);
            n->counts[ei] = countnode234(a);
            /*
             * That's built the big node in a, and destroyed b. Now
             * remove the reference to b (and e) in n.
             */
            for (j = ei; j < 2 && n->elems[j + 1]; j++) {
                n->elems[j] = n->elems[j + 1];
                n->kids[j + 1] = n->kids[j + 2];
                n->counts[j + 1] = n->counts[j + 2];
            }
            n->elems[j] = NULL;
            n->kids[j + 1] = NULL;
            n->counts[j + 1] = 0;
            /*
             * It's possible, in this case, that we've just removed
             * the only element in the root of the tree. If so,
             * shift the root.
             */
            if (n->elems[0] == NULL) {
                LOG(("  shifting root!\n"));
                t->root = a;
                a->parent = NULL;
                sfree(n);
            }
            /*
             * Now go round the deletion process again, with n
             * pointing at the new big node and e still the same.
             */
            n = a;
            index = a->counts[0] + a->counts[1] + 1;
        }
    }
}